

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvmapImage.cpp
# Opt level: O0

Rgba __thiscall EnvmapImage::sample(EnvmapImage *this,V2f *pos)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  float *in_RSI;
  half *in_RDI;
  Rgba p22;
  Rgba p21;
  Rgba p12;
  Rgba p11;
  float ty;
  float sy;
  int y2;
  int y1;
  float tx;
  float sx;
  int x2;
  int x1;
  Rgba p;
  float in_stack_ffffffffffffff3c;
  Rgba local_8;
  
  iVar1 = Imath_3_2::floor<float>(*in_RSI);
  Imath_3_2::clamp<int>(iVar1,*(int *)(in_RDI + 2),*(int *)(in_RDI + 6));
  Imath_3_2::clamp<int>(iVar1 + 1,*(int *)(in_RDI + 2),*(int *)(in_RDI + 6));
  iVar2 = Imath_3_2::floor<float>(in_RSI[1]);
  iVar3 = Imath_3_2::clamp<int>(iVar2,*(int *)(in_RDI + 4),*(int *)(in_RDI + 8));
  iVar1 = *(int *)(in_RDI + 4);
  iVar4 = Imath_3_2::clamp<int>(iVar2 + 1,*(int *)(in_RDI + 4),*(int *)(in_RDI + 8));
  iVar2 = *(int *)(in_RDI + 4);
  Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[]
            ((Array2D<Imf_3_2::Rgba> *)(in_RDI + 0xc),(long)(iVar3 - iVar1));
  Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[]
            ((Array2D<Imf_3_2::Rgba> *)(in_RDI + 0xc),(long)(iVar3 - iVar1));
  Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[]
            ((Array2D<Imf_3_2::Rgba> *)(in_RDI + 0xc),(long)(iVar4 - iVar2));
  Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[]
            ((Array2D<Imf_3_2::Rgba> *)(in_RDI + 0xc),(long)(iVar4 - iVar2));
  Imf_3_2::Rgba::Rgba(&local_8);
  Imath_3_2::half::operator_cast_to_float(in_RDI);
  Imath_3_2::half::operator_cast_to_float(in_RDI);
  Imath_3_2::half::operator_cast_to_float(in_RDI);
  Imath_3_2::half::operator_cast_to_float(in_RDI);
  Imath_3_2::half::operator=(in_RDI,in_stack_ffffffffffffff3c);
  Imath_3_2::half::operator_cast_to_float(in_RDI);
  Imath_3_2::half::operator_cast_to_float(in_RDI);
  Imath_3_2::half::operator_cast_to_float(in_RDI);
  Imath_3_2::half::operator_cast_to_float(in_RDI);
  Imath_3_2::half::operator=(in_RDI,in_stack_ffffffffffffff3c);
  Imath_3_2::half::operator_cast_to_float(in_RDI);
  Imath_3_2::half::operator_cast_to_float(in_RDI);
  Imath_3_2::half::operator_cast_to_float(in_RDI);
  Imath_3_2::half::operator_cast_to_float(in_RDI);
  Imath_3_2::half::operator=(in_RDI,in_stack_ffffffffffffff3c);
  Imath_3_2::half::operator_cast_to_float(in_RDI);
  Imath_3_2::half::operator_cast_to_float(in_RDI);
  Imath_3_2::half::operator_cast_to_float(in_RDI);
  Imath_3_2::half::operator_cast_to_float(in_RDI);
  Imath_3_2::half::operator=(in_RDI,in_stack_ffffffffffffff3c);
  return local_8;
}

Assistant:

Rgba
EnvmapImage::sample (const V2f& pos) const
{
    //
    // Point-sample the environment map image at 2D position pos.
    // Interpolate bilinearly between the four nearest pixels.
    //

    int   x1 = IMATH::floor (pos.x);
    int   x2 = x1 + 1;
    float sx = x2 - pos.x;
    float tx = 1 - sx;

    x1 = clamp (x1, _dataWindow.min.x, _dataWindow.max.x) - _dataWindow.min.x;
    x2 = clamp (x2, _dataWindow.min.x, _dataWindow.max.x) - _dataWindow.min.x;

    int   y1 = IMATH::floor (pos.y);
    int   y2 = y1 + 1;
    float sy = y2 - pos.y;
    float ty = 1 - sy;

    y1 = clamp (y1, _dataWindow.min.y, _dataWindow.max.y) - _dataWindow.min.y;
    y2 = clamp (y2, _dataWindow.min.y, _dataWindow.max.y) - _dataWindow.min.y;

    Rgba p11 = _pixels[y1][x1];
    Rgba p12 = _pixels[y1][x2];
    Rgba p21 = _pixels[y2][x1];
    Rgba p22 = _pixels[y2][x2];

    Rgba p;
    p.r = (p11.r * sx + p12.r * tx) * sy + (p21.r * sx + p22.r * tx) * ty;
    p.g = (p11.g * sx + p12.g * tx) * sy + (p21.g * sx + p22.g * tx) * ty;
    p.b = (p11.b * sx + p12.b * tx) * sy + (p21.b * sx + p22.b * tx) * ty;
    p.a = (p11.a * sx + p12.a * tx) * sy + (p21.a * sx + p22.a * tx) * ty;

    return p;
}